

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_response.h
# Opt level: O2

string __thiscall CreateResponse::ToString(CreateResponse *this)

{
  undefined1 auStack_68 [16];
  undefined1 local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  FileInfo::ToString((FileInfo *)&stack0xffffffffffffffe0);
  std::operator+(local_58 + 8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "CreateResponse:: ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_58 + 0x10),local_58 + 8);
  FileInfo::ToString((FileInfo *)local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_58 + 0x18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_58 + 0x10));
  std::operator+(&local_38,local_58 + 0x18);
  BlockInfo::ToString((BlockInfo *)(auStack_68 + 8));
  std::operator+(&local_30,&local_38);
  std::operator+(&local_28,(char *)&local_30);
  BlockInfo::ToString((BlockInfo *)auStack_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,&local_28
                );
  std::string::~string(auStack_68);
  std::string::~string(&local_28);
  std::string::~string(&local_30);
  std::string::~string(auStack_68 + 8);
  std::string::~string(&local_38);
  std::string::~string(local_58 + 0x18);
  std::string::~string(local_58);
  std::string::~string(local_58 + 0x10);
  std::string::~string(local_58 + 8);
  std::string::~string(&stack0xffffffffffffffe0);
  return (string)(_Alloc_hider)this;
}

Assistant:

virtual string ToString() const {
    return "CreateResponse:: " + file_info_.ToString() + ", " +
           parent_info_.ToString() + ", " + file_block_->ToString() + ", " +
           parent_block_->ToString();
  }